

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O0

int __thiscall
sqvector<SQObjectPtr>::copy(sqvector<SQObjectPtr> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  ulong local_40;
  SQUnsignedInteger i;
  SQObjectPtr local_28;
  EVP_PKEY_CTX *local_18;
  sqvector<SQObjectPtr> *v_local;
  sqvector<SQObjectPtr> *this_local;
  
  local_18 = dst;
  v_local = this;
  if (this->_size != 0) {
    ::SQObjectPtr::SQObjectPtr(&local_28);
    resize(this,0,&local_28);
    ::SQObjectPtr::~SQObjectPtr(&local_28);
  }
  if (this->_allocated < *(ulong *)(local_18 + 8)) {
    _realloc(this,*(SQUnsignedInteger *)(local_18 + 8));
  }
  for (local_40 = 0; local_40 < *(ulong *)(local_18 + 8); local_40 = local_40 + 1) {
    ::SQObjectPtr::SQObjectPtr
              (this->_vals + local_40,(SQObjectPtr *)(*(long *)local_18 + local_40 * 0x10));
  }
  this->_size = *(SQUnsignedInteger *)(local_18 + 8);
  return (int)this;
}

Assistant:

void copy(const sqvector<T>& v)
    {
        if(_size) {
            resize(0); //destroys all previous stuff
        }
        //resize(v._size);
        if(v._size > _allocated) {
            _realloc(v._size);
        }
        for(SQUnsignedInteger i = 0; i < v._size; i++) {
            new ((void *)&_vals[i]) T(v._vals[i]);
        }
        _size = v._size;
    }